

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_ObjCollectTfo_rec(Acb_Ntk_t *p,int iObj,int fTerm)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  if ((iObj < 0) || ((p->vObjTrav).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar3 = (p->vObjTrav).pArray;
  iVar1 = p->nObjTravs;
  iVar2 = piVar3[(uint)iObj];
  piVar3[(uint)iObj] = iVar1;
  if (iVar2 == iVar1) {
    return;
  }
  if (fTerm == 0) {
    if (iObj == 0) {
LAB_003829ba:
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                    ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
    }
    if ((p->vObjType).nSize <= iObj) {
LAB_003829d9:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    if ((p->vObjType).pArray[(uint)iObj] == '\x04') {
      return;
    }
  }
  if (iObj < (p->vFanouts).nSize) {
    lVar5 = 0;
    do {
      pVVar4 = (p->vFanouts).pArray;
      if (pVVar4[(uint)iObj].nSize <= lVar5) {
        Vec_IntPush(&p->vArray1,iObj);
        return;
      }
      iVar1 = pVVar4[(uint)iObj].pArray[lVar5];
      if ((long)iVar1 < 1) goto LAB_003829ba;
      if ((p->vObjType).nSize <= iVar1) goto LAB_003829d9;
      if ((p->vObjType).pArray[iVar1] != '\0') {
        Acb_ObjCollectTfo_rec(p,iVar1,fTerm);
      }
      lVar5 = lVar5 + 1;
    } while (iObj < (p->vFanouts).nSize);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Acb_ObjCollectTfo_rec( Acb_Ntk_t * p, int iObj, int fTerm )
{
    int iFanout, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( !fTerm && Acb_ObjIsCo(p, iObj) )
        return;
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        Acb_ObjCollectTfo_rec( p, iFanout, fTerm );
    Vec_IntPush( &p->vArray1, iObj );
}